

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_check.c
# Opt level: O2

int check_logical_error_lx(mod2sparse *l,char *orig_error,char *decoding)

{
  uint n;
  int iVar1;
  char *out_vec;
  char *v;
  
  iVar1 = l->n_rows;
  n = l->n_cols;
  out_vec = (char *)chk_alloc(n,1);
  v = (char *)chk_alloc(n,1);
  bin_char_add(orig_error,decoding,out_vec,n);
  mod2sparse_mulvec(l,out_vec,v);
  iVar1 = bin_char_is_zero(v,iVar1);
  free(v);
  free(out_vec);
  return (int)(iVar1 == 0);
}

Assistant:

int check_logical_error_lx(mod2sparse* l,char *orig_error,char *decoding){

    int n = mod2sparse_cols(l);
    int k = mod2sparse_rows(l);
    char *residual=chk_alloc(n,sizeof(*residual));
    char *log_check=chk_alloc(n,sizeof(*log_check));

    int logical_error=0;
    bin_char_add(orig_error,decoding,residual,n);
    mod2sparse_mulvec(l,residual,log_check);
    if(!bin_char_is_zero(log_check,k)) logical_error=1;

    free(log_check);
    free(residual);

    return logical_error;

}